

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Value * __thiscall
GlobOpt::NewFloatConstantValue(GlobOpt *this,FloatConstType floatValue,Opnd *opnd)

{
  FloatConstantValueInfo *valueInfo_00;
  Value *val_00;
  GlobOptBlockData *this_00;
  Value *val;
  FloatConstantValueInfo *valueInfo;
  Opnd *opnd_local;
  FloatConstType floatValue_local;
  GlobOpt *this_local;
  
  valueInfo_00 = FloatConstantValueInfo::New(this->alloc,floatValue);
  val_00 = NewValue(this,&valueInfo_00->super_ValueInfo);
  this_00 = CurrentBlockData(this);
  GlobOptBlockData::InsertNewValue(this_00,val_00,opnd);
  return val_00;
}

Assistant:

Value *
GlobOpt::NewFloatConstantValue(const FloatConstType floatValue, IR::Opnd *const opnd)
{
    FloatConstantValueInfo *valueInfo = FloatConstantValueInfo::New(this->alloc, floatValue);
    Value *val = NewValue(valueInfo);

    CurrentBlockData()->InsertNewValue(val, opnd);
    return val;
}